

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typed_statement.cc
# Opt level: O0

shared_ptr<const_tchecker::typed_statement_t> __thiscall
tchecker::typed_if_statement_t::then_stmt_ptr(typed_if_statement_t *this)

{
  long in_RSI;
  shared_ptr<const_tchecker::typed_statement_t> sVar1;
  typed_if_statement_t *this_local;
  
  if_statement_t::then_stmt_ptr((if_statement_t *)(in_RSI + 0x10));
  sVar1 = std::dynamic_pointer_cast<tchecker::typed_statement_t_const,tchecker::statement_t_const>
                    ((shared_ptr<const_tchecker::statement_t> *)this);
  sVar1.super___shared_ptr<const_tchecker::typed_statement_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &this->super_typed_statement_t;
  return (shared_ptr<const_tchecker::typed_statement_t>)
         sVar1.super___shared_ptr<const_tchecker::typed_statement_t,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<tchecker::typed_statement_t const> typed_if_statement_t::then_stmt_ptr() const
{
  return std::dynamic_pointer_cast<tchecker::typed_statement_t const>(tchecker::if_statement_t::then_stmt_ptr());
}